

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_mail_client.c
# Opt level: O3

int write_ssl_and_get_response(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char code [4];
  uchar data [128];
  char local_bc [140];
  
  printf("\n%s");
  if (len == 0) {
LAB_00110349:
    uVar4 = 0;
    while( true ) {
      do {
        local_bc[0x74] = '\0';
        local_bc[0x75] = '\0';
        local_bc[0x76] = '\0';
        local_bc[0x77] = '\0';
        local_bc[0x78] = '\0';
        local_bc[0x79] = '\0';
        local_bc[0x7a] = '\0';
        local_bc[0x7b] = '\0';
        local_bc[0x7c] = '\0';
        local_bc[0x7d] = '\0';
        local_bc[0x7e] = '\0';
        local_bc[0x7f] = '\0';
        local_bc[0x80] = '\0';
        local_bc[0x81] = '\0';
        local_bc[0x82] = '\0';
        local_bc[0x83] = '\0';
        local_bc[100] = '\0';
        local_bc[0x65] = '\0';
        local_bc[0x66] = '\0';
        local_bc[0x67] = '\0';
        local_bc[0x68] = '\0';
        local_bc[0x69] = '\0';
        local_bc[0x6a] = '\0';
        local_bc[0x6b] = '\0';
        local_bc[0x6c] = '\0';
        local_bc[0x6d] = '\0';
        local_bc[0x6e] = '\0';
        local_bc[0x6f] = '\0';
        local_bc[0x70] = '\0';
        local_bc[0x71] = '\0';
        local_bc[0x72] = '\0';
        local_bc[0x73] = '\0';
        local_bc[0x54] = '\0';
        local_bc[0x55] = '\0';
        local_bc[0x56] = '\0';
        local_bc[0x57] = '\0';
        local_bc[0x58] = '\0';
        local_bc[0x59] = '\0';
        local_bc[0x5a] = '\0';
        local_bc[0x5b] = '\0';
        local_bc[0x5c] = '\0';
        local_bc[0x5d] = '\0';
        local_bc[0x5e] = '\0';
        local_bc[0x5f] = '\0';
        local_bc[0x60] = '\0';
        local_bc[0x61] = '\0';
        local_bc[0x62] = '\0';
        local_bc[99] = '\0';
        local_bc[0x44] = '\0';
        local_bc[0x45] = '\0';
        local_bc[0x46] = '\0';
        local_bc[0x47] = '\0';
        local_bc[0x48] = '\0';
        local_bc[0x49] = '\0';
        local_bc[0x4a] = '\0';
        local_bc[0x4b] = '\0';
        local_bc[0x4c] = '\0';
        local_bc[0x4d] = '\0';
        local_bc[0x4e] = '\0';
        local_bc[0x4f] = '\0';
        local_bc[0x50] = '\0';
        local_bc[0x51] = '\0';
        local_bc[0x52] = '\0';
        local_bc[0x53] = '\0';
        local_bc[0x34] = '\0';
        local_bc[0x35] = '\0';
        local_bc[0x36] = '\0';
        local_bc[0x37] = '\0';
        local_bc[0x38] = '\0';
        local_bc[0x39] = '\0';
        local_bc[0x3a] = '\0';
        local_bc[0x3b] = '\0';
        local_bc[0x3c] = '\0';
        local_bc[0x3d] = '\0';
        local_bc[0x3e] = '\0';
        local_bc[0x3f] = '\0';
        local_bc[0x40] = '\0';
        local_bc[0x41] = '\0';
        local_bc[0x42] = '\0';
        local_bc[0x43] = '\0';
        local_bc[0x24] = '\0';
        local_bc[0x25] = '\0';
        local_bc[0x26] = '\0';
        local_bc[0x27] = '\0';
        local_bc[0x28] = '\0';
        local_bc[0x29] = '\0';
        local_bc[0x2a] = '\0';
        local_bc[0x2b] = '\0';
        local_bc[0x2c] = '\0';
        local_bc[0x2d] = '\0';
        local_bc[0x2e] = '\0';
        local_bc[0x2f] = '\0';
        local_bc[0x30] = '\0';
        local_bc[0x31] = '\0';
        local_bc[0x32] = '\0';
        local_bc[0x33] = '\0';
        local_bc[0x14] = '\0';
        local_bc[0x15] = '\0';
        local_bc[0x16] = '\0';
        local_bc[0x17] = '\0';
        local_bc[0x18] = '\0';
        local_bc[0x19] = '\0';
        local_bc[0x1a] = '\0';
        local_bc[0x1b] = '\0';
        local_bc[0x1c] = '\0';
        local_bc[0x1d] = '\0';
        local_bc[0x1e] = '\0';
        local_bc[0x1f] = '\0';
        local_bc[0x20] = '\0';
        local_bc[0x21] = '\0';
        local_bc[0x22] = '\0';
        local_bc[0x23] = '\0';
        local_bc[4] = '\0';
        local_bc[5] = '\0';
        local_bc[6] = '\0';
        local_bc[7] = '\0';
        local_bc[8] = '\0';
        local_bc[9] = '\0';
        local_bc[10] = '\0';
        local_bc[0xb] = '\0';
        local_bc[0xc] = '\0';
        local_bc[0xd] = '\0';
        local_bc[0xe] = '\0';
        local_bc[0xf] = '\0';
        local_bc[0x10] = '\0';
        local_bc[0x11] = '\0';
        local_bc[0x12] = '\0';
        local_bc[0x13] = '\0';
        uVar1 = mbedtls_ssl_read(ssl,(uchar *)(local_bc + 4),0x7f);
      } while ((uVar1 & 0xffffff7f) == 0xffff9700);
      if (uVar1 == 0xffff8780) {
        return -1;
      }
      if ((int)uVar1 < 1) break;
      printf("\n%s",local_bc + 4);
      uVar3 = 0;
      do {
        if (local_bc[uVar3 + 4] == '\n') {
          if ((uVar4 == 4) && ((byte)(local_bc[0] - 0x30U) < 10)) {
            uVar4 = 0;
            if (local_bc[3] == ' ') {
              local_bc[3] = 0;
              iVar2 = atoi(local_bc);
              return iVar2;
            }
          }
          else {
            uVar4 = 0;
          }
        }
        else if (uVar4 < 4) {
          local_bc[uVar4] = local_bc[uVar3 + 4];
          uVar4 = uVar4 + 1;
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    printf("failed\n  ! mbedtls_ssl_read returned %d\n\n",(ulong)uVar1);
  }
  else {
    do {
      uVar1 = mbedtls_ssl_write(ssl,buf,len);
      if (0 < (int)uVar1) goto LAB_00110349;
    } while ((uVar1 & 0xffffff7f) == 0xffff9700);
    printf(" failed\n  ! mbedtls_ssl_write returned %d\n\n",(ulong)uVar1);
  }
  return -1;
}

Assistant:

static int write_ssl_and_get_response( mbedtls_ssl_context *ssl, unsigned char *buf, size_t len )
{
    int ret;
    unsigned char data[128];
    char code[4];
    size_t i, idx = 0;

    mbedtls_printf("\n%s", buf);
    while( len && ( ret = mbedtls_ssl_write( ssl, buf, len ) ) <= 0 )
    {
        if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_write returned %d\n\n", ret );
            return -1;
        }
    }

    do
    {
        len = sizeof( data ) - 1;
        memset( data, 0, sizeof( data ) );
        ret = mbedtls_ssl_read( ssl, data, len );

        if( ret == MBEDTLS_ERR_SSL_WANT_READ || ret == MBEDTLS_ERR_SSL_WANT_WRITE )
            continue;

        if( ret == MBEDTLS_ERR_SSL_PEER_CLOSE_NOTIFY )
            return -1;

        if( ret <= 0 )
        {
            mbedtls_printf( "failed\n  ! mbedtls_ssl_read returned %d\n\n", ret );
            return -1;
        }

        mbedtls_printf("\n%s", data);
        len = ret;
        for( i = 0; i < len; i++ )
        {
            if( data[i] != '\n' )
            {
                if( idx < 4 )
                    code[ idx++ ] = data[i];
                continue;
            }

            if( idx == 4 && code[0] >= '0' && code[0] <= '9' && code[3] == ' ' )
            {
                code[3] = '\0';
                return atoi( code );
            }

            idx = 0;
        }
    }
    while( 1 );
}